

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O3

Matrix33d * gmath::createR(Matrix33d *__return_storage_ptr__,Vector3d *n,double phi)

{
  undefined8 uVar1;
  int i;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int i_1;
  long lVar5;
  double *pdVar6;
  int k_1;
  undefined8 *puVar7;
  int k;
  double dVar8;
  undefined1 auVar9 [16];
  SMatrix<double,_3,_3> ret_5;
  SMatrix<double,_3,_3> ret_4;
  SMatrix<double,_3,_3> ret_2;
  SMatrix<double,_3,_3> ret_1;
  SMatrix<double,_3,_3> ret_3;
  Matrix33d m1;
  undefined8 local_270;
  double local_268;
  double dStack_260;
  double local_258;
  undefined8 local_250;
  double local_248;
  double dStack_240;
  double local_238;
  undefined8 local_230;
  double local_228;
  double dStack_220;
  double local_218;
  double dStack_210;
  double local_208;
  double local_200;
  double local_1f8;
  double dStack_1f0;
  double local_1e8;
  undefined8 local_1d8 [54];
  
  __return_storage_ptr__->v[1][0] = 0.0;
  __return_storage_ptr__->v[1][1] = 0.0;
  __return_storage_ptr__->v[1][2] = 0.0;
  __return_storage_ptr__->v[2][0] = 0.0;
  __return_storage_ptr__->v[0][1] = 0.0;
  __return_storage_ptr__->v[0][2] = 0.0;
  __return_storage_ptr__->v[2][1] = 0.0;
  __return_storage_ptr__->v[0][0] = 1.0;
  __return_storage_ptr__->v[1][1] = 1.0;
  __return_storage_ptr__->v[2][2] = 1.0;
  dVar8 = 0.0;
  lVar2 = 0;
  do {
    dVar8 = dVar8 + n->v[lVar2] * n->v[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  if (dVar8 < 0.0) {
    dVar8 = sqrt(dVar8);
  }
  else {
    dVar8 = SQRT(dVar8);
  }
  if (0.0 < dVar8) {
    puVar4 = local_1d8 + 0x2d;
    local_1d8[0x30] = 0;
    local_1d8[0x32] = 0;
    local_1d8[0x33] = 0;
    local_1d8[0x2e] = 0;
    local_1d8[0x2f] = 0;
    lVar2 = 0;
    local_1d8[0x34] = 0;
    local_1d8[0x2d] = 0x3ff0000000000000;
    local_1d8[0x31] = 0x3ff0000000000000;
    local_1d8[0x35] = 0x3ff0000000000000;
    local_258 = n->v[2] / dVar8;
    auVar9._8_8_ = dVar8;
    auVar9._0_8_ = dVar8;
    auVar9 = divpd(*(undefined1 (*) [16])n->v,auVar9);
    local_270 = 0;
    local_268 = -local_258;
    local_238 = auVar9._0_8_;
    dStack_260 = auVar9._8_8_;
    local_228 = local_238 * local_238;
    dStack_220 = local_238 * dStack_260;
    local_250 = 0;
    local_248 = -local_238;
    dStack_240 = -dStack_260;
    local_218 = local_258 * local_238;
    local_200 = local_258 * dStack_260;
    local_208 = dStack_260 * dStack_260;
    local_1e8 = local_258 * local_258;
    local_230 = 0;
    dStack_210 = dStack_220;
    local_1f8 = local_218;
    dStack_1f0 = local_200;
    dVar8 = cos(phi);
    puVar3 = local_1d8 + 0x1b;
    local_1d8[0x1e] = 0;
    local_1d8[0x1c] = 0;
    local_1d8[0x1d] = 0;
    local_1d8[0x20] = 0;
    local_1d8[0x21] = 0;
    local_1d8[0x22] = 0;
    local_1d8[0x1b] = 0x3ff0000000000000;
    local_1d8[0x1f] = 0x3ff0000000000000;
    local_1d8[0x23] = 0x3ff0000000000000;
    do {
      lVar5 = 0;
      do {
        puVar3[lVar5] = (double)puVar4[lVar5] * dVar8;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar2 = lVar2 + 1;
      puVar3 = puVar3 + 3;
      puVar4 = puVar4 + 3;
    } while (lVar2 != 3);
    dVar8 = cos(phi);
    puVar4 = local_1d8 + 0x12;
    local_1d8[0x15] = 0;
    local_1d8[0x13] = 0;
    local_1d8[0x14] = 0;
    local_1d8[0x17] = 0;
    local_1d8[0x18] = 0;
    local_1d8[0x19] = 0;
    local_1d8[0x12] = 0x3ff0000000000000;
    local_1d8[0x16] = 0x3ff0000000000000;
    local_1d8[0x1a] = 0x3ff0000000000000;
    pdVar6 = &local_228;
    lVar2 = 0;
    do {
      lVar5 = 0;
      do {
        puVar4[lVar5] = pdVar6[lVar5] * (1.0 - dVar8);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar2 = lVar2 + 1;
      puVar4 = puVar4 + 3;
      pdVar6 = pdVar6 + 3;
    } while (lVar2 != 3);
    puVar4 = local_1d8 + 0x24;
    local_1d8[0x27] = 0;
    local_1d8[0x29] = 0;
    local_1d8[0x2a] = 0;
    local_1d8[0x25] = 0;
    local_1d8[0x26] = 0;
    local_1d8[0x2b] = 0;
    local_1d8[0x24] = 0x3ff0000000000000;
    local_1d8[0x28] = 0x3ff0000000000000;
    local_1d8[0x2c] = 0x3ff0000000000000;
    puVar3 = local_1d8 + 0x12;
    puVar7 = local_1d8 + 0x1b;
    lVar2 = 0;
    do {
      lVar5 = 0;
      do {
        puVar4[lVar5] = (double)puVar7[lVar5] + (double)puVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar2 = lVar2 + 1;
      puVar4 = puVar4 + 3;
      puVar3 = puVar3 + 3;
      puVar7 = puVar7 + 3;
    } while (lVar2 != 3);
    dVar8 = sin(phi);
    puVar3 = local_1d8 + 9;
    local_1d8[0xc] = 0;
    local_1d8[10] = 0;
    local_1d8[0xb] = 0;
    local_1d8[0xe] = 0;
    local_1d8[0xf] = 0;
    local_1d8[0x10] = 0;
    local_1d8[9] = 0x3ff0000000000000;
    local_1d8[0xd] = 0x3ff0000000000000;
    local_1d8[0x11] = 0x3ff0000000000000;
    puVar4 = &local_270;
    lVar2 = 0;
    do {
      lVar5 = 0;
      do {
        puVar3[lVar5] = (double)puVar4[lVar5] * dVar8;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar2 = lVar2 + 1;
      puVar3 = puVar3 + 3;
      puVar4 = puVar4 + 3;
    } while (lVar2 != 3);
    puVar4 = local_1d8;
    local_1d8[3] = 0;
    local_1d8[5] = 0;
    local_1d8[6] = 0;
    local_1d8[1] = 0;
    local_1d8[2] = 0;
    local_1d8[7] = 0;
    local_1d8[0] = 0x3ff0000000000000;
    local_1d8[4] = 0x3ff0000000000000;
    local_1d8[8] = 0x3ff0000000000000;
    puVar3 = local_1d8 + 9;
    puVar7 = local_1d8 + 0x24;
    lVar2 = 0;
    do {
      lVar5 = 0;
      do {
        puVar4[lVar5] = (double)puVar7[lVar5] + (double)puVar3[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar2 = lVar2 + 1;
      puVar4 = puVar4 + 3;
      puVar3 = puVar3 + 3;
      puVar7 = puVar7 + 3;
    } while (lVar2 != 3);
    lVar2 = 0;
    do {
      *(undefined8 *)((long)__return_storage_ptr__->v[0] + lVar2 + 0x10) =
           *(undefined8 *)((long)local_1d8 + lVar2 + 0x10);
      uVar1 = *(undefined8 *)((long)local_1d8 + lVar2 + 8);
      puVar4 = (undefined8 *)((long)__return_storage_ptr__->v[0] + lVar2);
      *puVar4 = *(undefined8 *)((long)local_1d8 + lVar2);
      puVar4[1] = uVar1;
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x48);
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix33d createR(const Vector3d &n, double phi)
{
  Matrix33d R;

  double l=norm(n);

  if (l > 0)
  {
    Matrix33d m1, m2, m3;

    double n1=n[0]/l;
    double n2=n[1]/l;
    double n3=n[2]/l;

    m2(0, 0)=n1*n1; m2(0, 1)=n1*n2; m2(0, 2)=n1*n3;
    m2(1, 0)=n2*n1; m2(1, 1)=n2*n2; m2(1, 2)=n2*n3;
    m2(2, 0)=n3*n1; m2(2, 1)=n3*n2; m2(2, 2)=n3*n3;

    m3(0, 0)=  0; m3(0, 1)=-n3; m3(0, 2)= n2;
    m3(1, 0)= n3; m3(1, 1)=  0; m3(1, 2)=-n1;
    m3(2, 0)=-n2; m3(2, 1)= n1; m3(2, 2)=  0;

    R=cos(phi)*m1 + (1-cos(phi))*m2 + sin(phi)*m3;
  }

  return R;
}